

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

string * google::protobuf::compiler::cpp::FieldComment<google::protobuf::FieldDescriptor>
                   (string *__return_storage_ptr__,FieldDescriptor *field,Options *options)

{
  ushort *puVar1;
  char *pcVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  bool bVar6;
  const_iterator __begin0;
  SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  DebugStringOptions local_3b;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  if (options->strip_nonfunctional_codegen == true) {
    puVar1 = (ushort *)(field->all_names_).payload_;
    pcVar3 = (char *)((long)puVar1 + ~(ulong)*puVar1);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (char *)((long)puVar1 + -1);
  }
  else {
    local_3b.include_comments = false;
    local_3b.elide_group_body = true;
    local_3b.elide_oneof_body = true;
    FieldDescriptor::DebugStringWithOptions_abi_cxx11_((string *)&local_70,field,&local_3b);
    bVar5 = (string_view *)local_70.pos_ == &local_70.curr_;
    if (bVar5) {
      local_38.text_._M_dataplus._M_p = (pointer)&local_38.text_.field_2;
      local_38.text_.field_2._8_8_ = local_70.curr_._M_str;
    }
    else {
      local_38.text_._M_dataplus._M_p = (pointer)local_70.pos_;
    }
    local_38.text_._M_string_length = CONCAT44(local_70._12_4_,local_70.state_);
    local_38.text_.field_2._M_allocated_capacity = local_70.curr_._M_len;
    paVar4 = &local_38.text_.field_2;
    bVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.pos_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0;
    local_70.splitter_ = &local_38;
    local_38.delimiter_.c_ = '\n';
    local_70.pos_ = 0;
    local_70.state_ = kInitState;
    local_70.curr_._M_len = 0;
    local_70.curr_._M_str = (char *)0x0;
    local_70.delimiter_.c_ = '\n';
    if (bVar5 || bVar6) {
      absl::lts_20250127::strings_internal::
      SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_70);
      bVar5 = local_70.state_ != kEndState;
    }
    else {
      local_70.state_ = kEndState;
      bVar5 = false;
      local_70.pos_ = local_38.text_._M_string_length;
    }
    if ((bVar5) || (local_70.pos_ != local_38.text_._M_string_length)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,local_70.curr_._M_str,
                 local_70.curr_._M_str + local_70.curr_._M_len);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38.text_._M_dataplus._M_p == paVar4) {
        return __return_storage_ptr__;
      }
      operator_delete(local_38.text_._M_dataplus._M_p,
                      local_38.text_.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.text_._M_dataplus._M_p != paVar4) {
      operator_delete(local_38.text_._M_dataplus._M_p,
                      local_38.text_.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "<unknown>";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldComment(const T* field, const Options& options) {
  if (options.strip_nonfunctional_codegen) {
    return std::string(field->name());
  }
  // Print the field's (or oneof's) proto-syntax definition as a comment.
  // We don't want to print group bodies so we cut off after the first
  // line.
  DebugStringOptions debug_options;
  debug_options.elide_group_body = true;
  debug_options.elide_oneof_body = true;

  for (absl::string_view chunk :
       absl::StrSplit(field->DebugStringWithOptions(debug_options), '\n')) {
    return std::string(chunk);
  }

  return "<unknown>";
}